

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O2

void anon_unknown.dwarf_1382a9::compressUncompress(unsigned_short *raw,int n)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  int nCompressed;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  Array<char> compressed;
  Array<unsigned_short> uncompressed;
  Array<char> local_40;
  Array<unsigned_short> local_30;
  
  uVar4 = (ulong)(n * 3 + 0x40000);
  local_40._data = (char *)operator_new__(uVar4);
  local_40._size = uVar4;
  Imf_2_5::Array<unsigned_short>::Array(&local_30,(ulong)(uint)n);
  std::operator<<((ostream *)&std::cout,"compressing ");
  std::ostream::flush();
  nCompressed = Imf_2_5::hufCompress(raw,n,local_40._data);
  std::operator<<((ostream *)&std::cout,"uncompressing ");
  std::ostream::flush();
  Imf_2_5::hufUncompress(local_40._data,nCompressed,local_30._data,n);
  std::operator<<((ostream *)&std::cout,"comparing: ");
  std::ostream::flush();
  uVar4 = 0;
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar4;
  }
  do {
    if (uVar5 == uVar4) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar3 = std::operator<<(poVar3," bytes, compressed ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,nCompressed);
      poVar3 = std::operator<<(poVar3," bytes");
      std::endl<char,std::char_traits<char>>(poVar3);
      Imf_2_5::Array<unsigned_short>::~Array(&local_30);
      Imf_2_5::Array<char>::~Array(&local_40);
      return;
    }
    puVar1 = local_30._data + uVar4;
    puVar2 = raw + uVar4;
    uVar4 = uVar4 + 1;
  } while (*puVar1 == *puVar2);
  __assert_fail("uncompressed[i] == raw[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testHuf.cpp"
                ,0x81,"void (anonymous namespace)::compressUncompress(const unsigned short *, int)")
  ;
}

Assistant:

void
compressUncompress (const unsigned short raw[], int n)
{
    Array <char> compressed (3 * n + 4 * 65536);
    Array <unsigned short> uncompressed (n);

    cout << "compressing " << flush;

    int nCompressed = hufCompress (raw, n, compressed);

    cout << "uncompressing " << flush;

    hufUncompress (compressed, nCompressed, uncompressed, n);

    cout << "comparing: " << flush;

    for (int i = 0; i < n; ++i)
	assert (uncompressed[i] == raw[i]);

    cout << sizeof (raw[0]) * n << " bytes, compressed " <<
	    nCompressed  << " bytes" << endl;
}